

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O2

void __thiscall
LogMsgTy::LogMsgTy(LogMsgTy *this,char *_fn,int _ln,char *_func,logLevelTy _lvl,char *_msg)

{
  rep rVar1;
  float fVar2;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  string *local_38;
  
  gLogCnt = gLogCnt + 1;
  this->counter = gLogCnt;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->wallTime).__d.__r = rVar1;
  fVar2 = DataRefs::GetMiscNetwTime(&dataRefs);
  this->netwTime = fVar2;
  local_38 = &this->fileName;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,_fn,&local_39);
  this->ln = _ln;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->func,_func,&local_3a);
  this->lvl = _lvl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->msg,_msg,&local_3b);
  this->bFlushed = false;
  str_replPers(&this->msg);
  return;
}

Assistant:

LogMsgTy::LogMsgTy (const char* _fn, int _ln, const char* _func,
                    logLevelTy _lvl, const char* _msg) :
counter(++gLogCnt),
wallTime(std::chrono::system_clock::now()),
netwTime(dataRefs.GetMiscNetwTime()),
fileName(_fn), ln(_ln), func(_func), lvl(_lvl), msg(_msg), bFlushed(false)
{
    // Remove personal information
    str_replPers(msg);

}